

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_awareness
               (textblock *tb,monster_race *race,monster_lore_conflict *lore,bitflag *known_flags)

{
  monster_sex_t sex;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *aware;
  monster_sex_t msex;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    if ((lore->sleep_known & 1U) != 0) {
      pcVar1 = lore_describe_awareness((int16_t)race->sleep);
      pcVar2 = lore_pronoun_nominative(sex,true);
      pcVar3 = lore_pronoun_nominative(sex,false);
      textblock_append(tb,"%s %s intruders, which %s may notice from ",pcVar2,pcVar1,pcVar3);
      textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)(race->hearing * 10));
      textblock_append(tb," feet.  ");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-lore.c"
                ,0x597,
                "void lore_append_awareness(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_awareness(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Do we know how aware it is? */
	if (lore->sleep_known)
	{
		const char *aware = lore_describe_awareness(race->sleep);
		textblock_append(tb, "%s %s intruders, which %s may notice from ",
						 lore_pronoun_nominative(msex, true), aware,
						 lore_pronoun_nominative(msex, false));
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", 10 * race->hearing);
		textblock_append(tb, " feet.  ");
	}
}